

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O1

int bcf_update_alleles_str(bcf_hdr_t *hdr,bcf1_t *line,char *alleles_string)

{
  int *piVar1;
  char cVar2;
  uint uVar3;
  size_t sVar4;
  char *__dest;
  char **ppcVar5;
  ulong uVar6;
  uint uVar7;
  ulong __size;
  char *pcVar8;
  
  pcVar8 = (line->d).als;
  __size = (ulong)(line->d).m_als;
  sVar4 = strlen(alleles_string);
  sVar4 = (size_t)(int)sVar4;
  uVar6 = sVar4 + 1;
  __dest = pcVar8;
  if (__size <= uVar6) {
    uVar6 = uVar6 >> 1 | uVar6;
    uVar6 = uVar6 >> 2 | uVar6;
    uVar6 = uVar6 >> 4 | uVar6;
    uVar6 = uVar6 >> 8 | uVar6;
    __size = (uVar6 >> 0x10 | uVar6) + 1;
    __dest = (char *)realloc(pcVar8,__size);
    if (__dest == (char *)0x0) goto LAB_00124678;
  }
  memcpy(__dest,alleles_string,sVar4);
  __dest[sVar4] = '\0';
  pcVar8 = __dest;
LAB_00124678:
  (line->d).als = pcVar8;
  (line->d).m_als = (int)__size;
  uVar7 = 1;
  do {
    if (*pcVar8 == ',') {
      *pcVar8 = '\0';
      uVar7 = uVar7 + 1;
    }
    else if (*pcVar8 == '\0') {
      piVar1 = &(line->d).shared_dirty;
      *(byte *)piVar1 = (byte)*piVar1 | 2;
      *(short *)&line->field_0x12 = (short)uVar7;
      if ((line->d).m_allele < (int)(uVar7 & 0xffff)) {
        uVar3 = (uVar7 & 0xffff) - 1;
        uVar3 = (int)uVar3 >> 1 | uVar3;
        uVar3 = (int)uVar3 >> 2 | uVar3;
        uVar3 = (int)uVar3 >> 4 | uVar3;
        uVar3 = (int)uVar3 >> 8 | uVar3;
        uVar3 = (int)uVar3 >> 0x10 | uVar3;
        (line->d).m_allele = uVar3 + 1;
        ppcVar5 = (char **)realloc((line->d).allele,(long)(int)uVar3 * 8 + 8);
        (line->d).allele = ppcVar5;
      }
      if (0 < (int)uVar7) {
        pcVar8 = (line->d).als;
        uVar6 = 0;
        do {
          (line->d).allele[uVar6] = pcVar8;
          do {
            cVar2 = *pcVar8;
            pcVar8 = pcVar8 + 1;
          } while (cVar2 != '\0');
          uVar6 = uVar6 + 1;
        } while (uVar6 != uVar7);
      }
      return 0;
    }
    pcVar8 = pcVar8 + 1;
  } while( true );
}

Assistant:

int bcf_update_alleles_str(const bcf_hdr_t *hdr, bcf1_t *line, const char *alleles_string)
{
    kstring_t tmp;
    tmp.l = 0; tmp.s = line->d.als; tmp.m = line->d.m_als;
    kputs(alleles_string, &tmp);
    line->d.als = tmp.s; line->d.m_als = tmp.m;

    int nals = 1;
    char *t = line->d.als;
    while (*t)
    {
        if ( *t==',' ) { *t = 0; nals++; }
        t++;
    }
    return _bcf1_sync_alleles(hdr, line, nals);
}